

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O2

JsErrorCode JsGetPromiseState(JsValueRef promise,JsPromiseState *state)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  JsErrorCode exitStatus;
  JsrtContext *currentContext;
  undefined4 *puVar4;
  RecyclableObject *value;
  JavascriptPromise *pJVar5;
  ScriptContext *__localScriptContext;
  JsPromiseState JVar6;
  void *unaff_retaddr;
  undefined1 auStack_a8 [8];
  ScriptEntryExitRecord __entryExitRecord;
  EnterScriptObject __enterScriptObject;
  TTDRecorder _actionEntryPopper;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  __enterScriptObject.library = (JavascriptLibrary *)0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  currentContext = JsrtContext::GetCurrent();
  exitStatus = CheckContext(currentContext,false,false);
  if (exitStatus != JsNoError) goto LAB_003b60dd;
  scriptContext =
       (((currentContext->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4),
             ExceptionType_JavascriptException|ExceptionType_OutOfMemory);
  __entryExitRecord.frameIdOfScriptExitFunction = (void *)0x0;
  __entryExitRecord.scriptContext = (ScriptContext *)0x0;
  __entryExitRecord.next = (ScriptEntryExitRecord *)0x0;
  __entryExitRecord.returnAddrOfScriptEntryFunction = (void *)0x0;
  __entryExitRecord.addrOfReturnAddrOfScriptEntryFunction = (void *)0x0;
  auStack_a8 = (undefined1  [8])0x0;
  __entryExitRecord._0_1_ = 0;
  __entryExitRecord.savedImplicitCallFlags = ImplicitCall_HasNoInfo;
  __entryExitRecord._2_6_ = 0;
  Js::EnterScriptObject::EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType,scriptContext,
             (ScriptEntryExitRecord *)auStack_a8,unaff_retaddr,&stack0x00000000,true,true,true);
  JVar6 = JsPromiseStateFulfilled;
  Js::ScriptContext::OnScriptStart(scriptContext,true,true);
  Js::EnterScriptObject::VerifyEnterScript
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/Core/JsrtCore.cpp"
                       ,0x3e0,"(false)","Need to implement support here!!!");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  exitStatus = JsErrorInvalidArgument;
  if (promise != (JsValueRef)0x0) {
    if ((ulong)promise >> 0x30 == 0) {
      value = Js::VarTo<Js::RecyclableObject>(promise);
      pSVar1 = (((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_003b60cb;
        promise = Js::CrossSite::MarshalVar(scriptContext,value,false);
      }
    }
    if (state == (JsPromiseState *)0x0) {
      exitStatus = JsErrorNullArgument;
    }
    else {
      *state = JsPromiseStatePending;
      bVar3 = Js::VarIs<Js::JavascriptPromise>(promise);
      exitStatus = JsErrorInvalidArgument;
      if (bVar3) {
        pJVar5 = Js::VarTo<Js::JavascriptPromise>(promise);
        exitStatus = JsNoError;
        if (pJVar5->status == PromiseStatusCode_HasRejection) {
          JVar6 = JsPromiseStateRejected;
        }
        else if (pJVar5->status != PromiseStatusCode_HasResolution) goto LAB_003b60cb;
        *state = JVar6;
      }
    }
  }
LAB_003b60cb:
  Js::EnterScriptObject::~EnterScriptObject
            ((EnterScriptObject *)&__entryExitRecord.handledExceptionType);
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
            ((AutoNestedHandledExceptionType *)((long)&_actionEntryPopper.m_resultPtr + 4));
LAB_003b60dd:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)&__enterScriptObject.library,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsGetPromiseState(_In_ JsValueRef promise, _Out_ JsPromiseState *state)
{
    return ContextAPIWrapper<JSRT_MAYBE_TRUE>([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION_NOT_IMPLEMENTED(scriptContext);

        VALIDATE_INCOMING_REFERENCE(promise, scriptContext);
        PARAM_NOT_NULL(state);

        *state = JsPromiseStatePending;

        if (!Js::VarIs<Js::JavascriptPromise>(promise))
        {
            return JsErrorInvalidArgument;
        }

        Js::JavascriptPromise *jsPromise = Js::VarTo<Js::JavascriptPromise>(promise);
        Js::JavascriptPromise::PromiseStatus status = jsPromise->GetStatus();

        switch (status)
        {
        case Js::JavascriptPromise::PromiseStatus::PromiseStatusCode_HasRejection:
            *state = JsPromiseStateRejected;
            break;

        case Js::JavascriptPromise::PromiseStatus::PromiseStatusCode_HasResolution:
            *state = JsPromiseStateFulfilled;
            break;
        }

        return JsNoError;
    });
}